

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreateExtkeyFromParentKeyRequest * __thiscall
cfd::js::api::json::CreateExtkeyFromParentKeyRequest::GetParentKeyString_abi_cxx11_
          (CreateExtkeyFromParentKeyRequest *this,CreateExtkeyFromParentKeyRequest *obj)

{
  CreateExtkeyFromParentKeyRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->parent_key_);
  return this;
}

Assistant:

static std::string GetParentKeyString(  // line separate
      const CreateExtkeyFromParentKeyRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.parent_key_);
  }